

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

Iterator * __thiscall
leveldb::Version::NewConcatenatingIterator(Version *this,ReadOptions *options,int level)

{
  LevelFileNumIterator *this_00;
  Iterator *pIVar1;
  
  this_00 = (LevelFileNumIterator *)operator_new(0x58);
  LevelFileNumIterator::LevelFileNumIterator(this_00,&this->vset_->icmp_,this->files_ + level);
  pIVar1 = NewTwoLevelIterator((Iterator *)this_00,GetFileIterator,this->vset_->table_cache_,options
                              );
  return pIVar1;
}

Assistant:

Iterator* Version::NewConcatenatingIterator(const ReadOptions& options,
                                            int level) const {
  return NewTwoLevelIterator(
      new LevelFileNumIterator(vset_->icmp_, &files_[level]), &GetFileIterator,
      vset_->table_cache_, options);
}